

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvui.h
# Opt level: O0

void cvui::update(String *theWindowName)

{
  bool bVar1;
  int local_58;
  allocator<char> local_41;
  string local_40;
  undefined1 local_1d;
  int local_1c;
  bool aAnyInputFocused;
  cvui_context_t *pcStack_18;
  int i;
  cvui_context_t *aContext;
  String *theWindowName_local;
  
  aContext = (cvui_context_t *)theWindowName;
  pcStack_18 = internal::getContext(theWindowName);
  (pcStack_18->mouse).anyButton.justReleased = false;
  (pcStack_18->mouse).anyButton.justPressed = false;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    (pcStack_18->mouse).buttons[local_1c].justReleased = false;
    (pcStack_18->mouse).buttons[local_1c].justPressed = false;
  }
  internal::resetRenderingBuffer((cvui_block_t *)internal::gScreen);
  local_1d = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             internal::gInput,"");
  if ((bool)local_1d) {
    if (internal::gDelayWaitKey < 1) {
      local_58 = 0x28;
    }
    else {
      local_58 = internal::gDelayWaitKey;
    }
    internal::gLastInputKeyPressed = cv::waitKeyEx(local_58);
  }
  if (0 < internal::gDelayWaitKey) {
    internal::gLastKeyPressed = cv::waitKey(internal::gDelayWaitKey);
  }
  bVar1 = internal::blockStackEmpty();
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,
               "Calling update() before finishing all begin*()/end*() calls. Did you forget to call a begin*() or an end*()? Check if every begin*() has an appropriate end*() call before you call update()."
               ,&local_41);
    internal::error(2,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return;
}

Assistant:

void update(const cv::String& theWindowName) {
	cvui_context_t& aContext = internal::getContext(theWindowName);

	aContext.mouse.anyButton.justReleased = false;
	aContext.mouse.anyButton.justPressed = false;

	for (int i = cvui::LEFT_BUTTON; i <= cvui::RIGHT_BUTTON; i++) {
		aContext.mouse.buttons[i].justReleased = false;
		aContext.mouse.buttons[i].justPressed = false;
	}

	internal::resetRenderingBuffer(internal::gScreen);

    bool aAnyInputFocused = internal::gInput.name != "";

	if (aAnyInputFocused) {
		internal::gLastInputKeyPressed = cv::waitKeyEx(internal::gDelayWaitKey > 0 ? internal::gDelayWaitKey : 40);
	}

	// If we were told to keep track of the keyboard shortcuts, we
	// proceed to handle opencv event queue.
	if (internal::gDelayWaitKey > 0) {
		internal::gLastKeyPressed = cv::waitKey(internal::gDelayWaitKey);
	}

	if (!internal::blockStackEmpty()) {
		internal::error(2, "Calling update() before finishing all begin*()/end*() calls. Did you forget to call a begin*() or an end*()? Check if every begin*() has an appropriate end*() call before you call update().");
	}
}